

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::deleteFramebuffers(GLContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  int local_24;
  int i;
  deUint32 *framebuffers_local;
  int numFramebuffers_local;
  GLContext *this_local;
  
  for (local_24 = 0; local_24 < numFramebuffers; local_24 = local_24 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              (&this->m_allocatedFbos,framebuffers + local_24);
  }
  glu::CallLogWrapper::glDeleteFramebuffers(this->m_wrapper,numFramebuffers,framebuffers);
  return;
}

Assistant:

void GLContext::deleteFramebuffers (int numFramebuffers, const deUint32* framebuffers)
{
	for (int i = 0; i < numFramebuffers; i++)
		m_allocatedFbos.erase(framebuffers[i]);
	m_wrapper->glDeleteFramebuffers(numFramebuffers, framebuffers);
}